

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O2

RK_S32 mpp_hevc_decode_short_term_rps
                 (HEVCContext *s,ShortTermRPS *rps,HEVCSPS *sps,RK_S32 is_slice_header)

{
  ShortTermRPS *pSVar1;
  RK_U8 RVar2;
  RK_S32 RVar3;
  BitReadCtx_t *bitctx;
  MPP_RET MVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  RK_S32 _out;
  int local_3c;
  ulong local_38;
  
  bitctx = &s->HEVClc->gb;
  pSVar1 = sps->st_rps;
  if ((pSVar1 != rps) && (sps->nb_st_rps != 0)) {
    MVar4 = mpp_read_bits(bitctx,1,&_out);
    bitctx->ret = MVar4;
    if (MVar4 != MPP_OK) {
      return -0x3ec;
    }
    if ((RK_U8)_out != '\0') {
      if (is_slice_header == 0) {
        uVar6 = ((long)rps - (long)pSVar1) / 0xac - 1;
      }
      else {
        MVar4 = mpp_read_ue(bitctx,(RK_U32 *)&_out);
        bitctx->ret = MVar4;
        if (MVar4 != MPP_OK) {
          return -0x3ec;
        }
        uVar6 = (ulong)(sps->nb_st_rps - (_out + 1U));
        if (sps->nb_st_rps < _out + 1U) {
          _mpp_log_l(2,"H265PARSER_PS","Invalid value of delta_idx in slice header RPS: %d > %d.\n",
                     (char *)0x0);
          return -0x3ec;
        }
      }
      MVar4 = mpp_read_bits(bitctx,1,&_out);
      RVar3 = _out;
      bitctx->ret = MVar4;
      if (MVar4 != MPP_OK) {
        return -0x3ec;
      }
      MVar4 = mpp_read_ue(bitctx,(RK_U32 *)&_out);
      bitctx->ret = MVar4;
      if (MVar4 != MPP_OK) {
        return -0x3ec;
      }
      local_3c = (_out + 1) * ((RVar3 & 0xffU) * -2 + 1);
      lVar8 = 0;
      iVar12 = 0;
      local_38 = 0;
      do {
        lVar11 = (long)iVar12;
        if (pSVar1[uVar6].num_delta_pocs < lVar8) {
          rps->num_delta_pocs = iVar12;
          uVar10 = (uint)local_38;
          rps->num_negative_pics = uVar10;
          if (iVar12 != 0) {
            lVar7 = 0;
            for (lVar8 = 1; lVar8 < lVar11; lVar8 = lVar8 + 1) {
              iVar12 = rps->delta_poc[lVar8];
              RVar2 = rps->used[lVar8];
              for (lVar9 = lVar7; lVar9 != -1 && -1 < lVar9 + 1; lVar9 = lVar9 + -1) {
                if (iVar12 < rps->delta_poc[lVar9]) {
                  rps->delta_poc[lVar9 + 1] = rps->delta_poc[lVar9];
                  rps->used[lVar9 + 1] = rps->used[lVar9];
                  rps->delta_poc[lVar9] = iVar12;
                  rps->used[lVar9] = RVar2;
                }
              }
              lVar7 = lVar7 + 1;
            }
          }
          if (uVar10 < 2) {
            return 0;
          }
          for (uVar6 = 0; uVar10 = uVar10 - 1, uVar6 < rps->num_negative_pics >> 1;
              uVar6 = uVar6 + 1) {
            RVar3 = rps->delta_poc[uVar6];
            RVar2 = rps->used[uVar6];
            rps->delta_poc[uVar6] = rps->delta_poc[(int)uVar10];
            rps->used[uVar6] = rps->used[(int)uVar10];
            rps->delta_poc[(int)uVar10] = RVar3;
            rps->used[(int)uVar10] = RVar2;
          }
          return 0;
        }
        MVar4 = mpp_read_bits(bitctx,1,&_out);
        bitctx->ret = MVar4;
        if (MVar4 != MPP_OK) {
          return -0x3ec;
        }
        rps->used[lVar11] = (RK_U8)_out;
        if (_out == 0) {
          MVar4 = mpp_read_bits(bitctx,1,&_out);
          bitctx->ret = MVar4;
          if (MVar4 != MPP_OK) {
            return -0x3ec;
          }
          if ((RK_U8)_out != '\0') goto LAB_00199dea;
        }
        else {
LAB_00199dea:
          iVar5 = local_3c;
          if (lVar8 < pSVar1[uVar6].num_delta_pocs) {
            iVar5 = pSVar1[uVar6].delta_poc[lVar8] + local_3c;
          }
          rps->delta_poc[lVar11] = iVar5;
          local_38 = (ulong)(uint)((int)local_38 - (iVar5 >> 0x1f));
          iVar12 = iVar12 + 1;
        }
        lVar8 = lVar8 + 1;
      } while( true );
    }
  }
  MVar4 = mpp_read_ue(bitctx,(RK_U32 *)&_out);
  bitctx->ret = MVar4;
  if (MVar4 == MPP_OK) {
    rps->num_negative_pics = _out;
    MVar4 = mpp_read_ue(bitctx,(RK_U32 *)&_out);
    RVar3 = _out;
    bitctx->ret = MVar4;
    if (MVar4 != MPP_OK) {
      return -0x3ec;
    }
    uVar10 = rps->num_negative_pics;
    if ((uint)_out < 0x10 && uVar10 < 0x10) {
      rps->num_delta_pocs = uVar10 + _out;
      if (uVar10 + _out != 0) {
        iVar12 = 0;
        for (uVar6 = 0; uVar6 < uVar10; uVar6 = uVar6 + 1) {
          MVar4 = mpp_read_ue(bitctx,(RK_U32 *)&_out);
          bitctx->ret = MVar4;
          if (MVar4 != MPP_OK) {
            return -0x3ec;
          }
          iVar12 = iVar12 + ~_out;
          rps->delta_poc[uVar6] = iVar12;
          MVar4 = mpp_read_bits(bitctx,1,&_out);
          bitctx->ret = MVar4;
          if (MVar4 != MPP_OK) {
            return -0x3ec;
          }
          rps->used[uVar6] = (RK_U8)_out;
          uVar10 = rps->num_negative_pics;
        }
        iVar12 = 0;
        for (iVar5 = 0; RVar3 != iVar5; iVar5 = iVar5 + 1) {
          MVar4 = mpp_read_ue(bitctx,(RK_U32 *)&_out);
          bitctx->ret = MVar4;
          if (MVar4 != MPP_OK) {
            return -0x3ec;
          }
          iVar12 = iVar12 + _out + 1;
          rps->delta_poc[rps->num_negative_pics + iVar5] = iVar12;
          MVar4 = mpp_read_bits(bitctx,1,&_out);
          bitctx->ret = MVar4;
          if (MVar4 != MPP_OK) {
            return -0x3ec;
          }
          rps->used[rps->num_negative_pics + iVar5] = (RK_U8)_out;
        }
      }
      return 0;
    }
    _mpp_log_l(2,"H265PARSER_PS","Too many refs in a short term RPS.\n",(char *)0x0);
  }
  return -0x3ec;
}

Assistant:

int mpp_hevc_decode_short_term_rps(HEVCContext *s, ShortTermRPS *rps,
                                   const HEVCSPS *sps, RK_S32 is_slice_header)
{
    HEVCLocalContext *lc = s->HEVClc;
    RK_U8 rps_predict = 0;
    RK_S32 delta_poc;
    RK_S32 k0 = 0;
    RK_S32 k  = 0;
    RK_S32 i;

    BitReadCtx_t *gb = &lc->gb;

    if (rps != sps->st_rps && sps->nb_st_rps)
        READ_ONEBIT(gb, &rps_predict);

    if (rps_predict) {
        const ShortTermRPS *rps_ridx;
        RK_S32 delta_rps, abs_delta_rps;
        RK_U8 use_delta_flag = 0;
        RK_U8 delta_rps_sign;

        if (is_slice_header) {
            RK_U32 delta_idx = 0;
            READ_UE(gb, &delta_idx);
            delta_idx = delta_idx + 1;
            if (delta_idx > sps->nb_st_rps) {
                mpp_err(
                    "Invalid value of delta_idx in slice header RPS: %d > %d.\n",
                    delta_idx, sps->nb_st_rps);
                return  MPP_ERR_STREAM;
            }
            rps_ridx = &sps->st_rps[sps->nb_st_rps - delta_idx];
        } else
            rps_ridx = &sps->st_rps[rps - sps->st_rps - 1];

        READ_BITS(gb, 1, &delta_rps_sign);

        READ_UE(gb, &abs_delta_rps);

        abs_delta_rps = abs_delta_rps + 1;

        delta_rps      = (1 - (delta_rps_sign << 1)) * abs_delta_rps;
        for (i = 0; i <= rps_ridx->num_delta_pocs; i++) {
            RK_S32 used = 0;
            READ_ONEBIT(gb, &used);

            rps->used[k] = used;

            if (!used)
                READ_ONEBIT(gb, &use_delta_flag);

            if (used || use_delta_flag) {
                if (i < rps_ridx->num_delta_pocs)
                    delta_poc = delta_rps + rps_ridx->delta_poc[i];
                else
                    delta_poc = delta_rps;
                rps->delta_poc[k] = delta_poc;
                if (delta_poc < 0)
                    k0++;
                k++;
            }
        }

        rps->num_delta_pocs    = k;
        rps->num_negative_pics = k0;
        // sort in increasing order (smallest first)
        if (rps->num_delta_pocs != 0) {
            RK_S32 used, tmp;
            for (i = 1; i < rps->num_delta_pocs; i++) {
                delta_poc = rps->delta_poc[i];
                used      = rps->used[i];
                for (k = i - 1; k >= 0; k--) {
                    tmp = rps->delta_poc[k];
                    if (delta_poc < tmp) {
                        rps->delta_poc[k + 1] = tmp;
                        rps->used[k + 1]      = rps->used[k];
                        rps->delta_poc[k]     = delta_poc;
                        rps->used[k]          = used;
                    }
                }
            }
        }
        if ((rps->num_negative_pics >> 1) != 0) {
            RK_S32 used;
            k = rps->num_negative_pics - 1;
            // flip the negative values to largest first
            for (i = 0; (RK_U32)i < rps->num_negative_pics >> 1; i++) {
                delta_poc         = rps->delta_poc[i];
                used              = rps->used[i];
                rps->delta_poc[i] = rps->delta_poc[k];
                rps->used[i]      = rps->used[k];
                rps->delta_poc[k] = delta_poc;
                rps->used[k]      = used;
                k--;
            }
        }
    } else {
        RK_U32 prev, nb_positive_pics;

        READ_UE(gb, &rps->num_negative_pics);

        READ_UE(gb, &nb_positive_pics);

        if (rps->num_negative_pics >= MAX_REFS ||
            nb_positive_pics >= MAX_REFS) {
            mpp_err( "Too many refs in a short term RPS.\n");
            return  MPP_ERR_STREAM;
        }

        rps->num_delta_pocs = rps->num_negative_pics + nb_positive_pics;
        if (rps->num_delta_pocs) {
            prev = 0;
            for (i = 0; (RK_U32)i < rps->num_negative_pics; i++) {
                READ_UE(gb, &delta_poc);
                delta_poc += 1;
                prev -= delta_poc;
                rps->delta_poc[i] = prev;
                READ_ONEBIT(gb, &rps->used[i]);
            }
            prev = 0;
            for (i = 0; (RK_U32)i < nb_positive_pics; i++) {
                READ_UE(gb, &delta_poc);
                delta_poc = delta_poc + 1;
                prev += delta_poc;
                rps->delta_poc[rps->num_negative_pics + i] = prev;
                READ_ONEBIT(gb, &rps->used[rps->num_negative_pics + i]);
            }
        }
    }
    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}